

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-trait.c
# Opt level: O3

void borg_notice(_Bool notice_swap)

{
  int *piVar1;
  borg_item *item;
  uint8_t uVar2;
  _Bool _Var3;
  short sVar4;
  short sVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  player_race *ppVar13;
  short *psVar14;
  object *poVar15;
  bool bVar16;
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [14];
  undefined1 auVar20 [13];
  undefined1 auVar21 [14];
  char *pcVar22;
  player *p;
  _Bool _Var23;
  int16_t iVar24;
  short sVar25;
  ushort uVar26;
  wchar_t wVar27;
  uint uVar28;
  angband_constants *paVar30;
  int *piVar31;
  undefined8 uVar32;
  borg_item_conflict *pbVar33;
  int iVar34;
  wchar_t wVar35;
  borg_item_conflict *pbVar36;
  long lVar37;
  int iVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  undefined7 in_register_00000039;
  byte bVar43;
  byte bVar44;
  long lVar45;
  uint uVar46;
  bitflag *flags;
  ulong uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  bitflag f [5];
  bitflag local_7c [5];
  byte local_77;
  byte local_76;
  byte local_75;
  byte local_74;
  byte local_73;
  byte local_72;
  byte local_71;
  int local_70;
  int local_6c;
  bitflag *local_68;
  undefined4 local_60;
  uint local_5c;
  int local_58;
  int local_54;
  undefined8 local_50;
  int16_t local_48;
  player_class *local_40;
  ulong local_38;
  uint uVar29;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined2 uVar54;
  
  local_60 = (undefined4)CONCAT71(in_register_00000039,notice_swap);
  memset(borg.has,0,(ulong)z_info->k_max << 2);
  memset(borg.trait,0,0x424);
  memset(borg.activation,0,(ulong)z_info->act_max << 2);
  piVar31 = borg.trait;
  borg.trait[0x92] = 1;
  piVar31[0x2c] = 0x6e;
  piVar31[0x98] = -1;
  piVar31[0x99] = 4;
  borg_notice_player();
  if (borg_do_spell == true) {
    borg_cheat_spells();
    borg_do_spell = false;
  }
  piVar31 = borg.trait;
  p = player;
  ppVar13 = player->race;
  local_40 = player->class;
  borg.trait[0x34] = ppVar13->infra;
  piVar31[0x36] = local_40->c_skills[0] + ppVar13->r_skills[0];
  piVar31[0x37] = local_40->c_skills[1] + ppVar13->r_skills[1];
  piVar31[0x38] = local_40->c_skills[2] + ppVar13->r_skills[2];
  piVar31[0x39] = local_40->c_skills[3] + ppVar13->r_skills[3];
  piVar31[0x3a] = local_40->c_skills[5] + ppVar13->r_skills[5];
  piVar31[0x3b] = local_40->c_skills[4] + ppVar13->r_skills[4];
  piVar31[0x3c] = local_40->c_skills[6] + ppVar13->r_skills[6];
  piVar31[0x3d] = local_40->c_skills[7] + ppVar13->r_skills[7];
  piVar31[0x3e] = local_40->c_skills[8] + ppVar13->r_skills[8];
  piVar31[0x3f] = local_40->c_skills[9] + ppVar13->r_skills[9];
  player_flags(p,local_7c);
  _Var23 = flag_has_dbg(local_7c,5,10,"f","OF_SLOW_DIGEST");
  if (_Var23) {
    borg.trait[0x30] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,5,0xb,"f","OF_FEATHER");
  if (_Var23) {
    borg.trait[0x31] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,5,0xc,"f","OF_REGEN");
  if (_Var23) {
    borg.trait[0x32] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,5,0xd,"f","OF_TELEPATHY");
  if (_Var23) {
    borg.trait[0x25] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,5,0xe,"f","OF_SEE_INVIS");
  if (_Var23) {
    borg.trait[0x33] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,5,0xf,"f","OF_FREE_ACT");
  if (_Var23) {
    borg.trait[0x56] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,5,0x10,"f","OF_HOLD_LIFE");
  if (_Var23) {
    borg.trait[0x55] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,5,0x11,"f","OF_IMPACT");
  if (_Var23) {
    borg.trait[0xcc] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,5,0x1a,"f","OF_AGGRAVATE");
  if (_Var23) {
    borg.trait[0xae] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,5,0x18,"f","OF_AFRAID");
  if (_Var23) {
    borg.trait[0xba] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,5,0x1b,"f","OF_DRAIN_EXP");
  if (_Var23) {
    borg.trait[0xbb] = 1;
  }
  sVar25 = ppVar13->el_info[2].res_level;
  if (sVar25 == -1) {
    borg.trait[0xbc] = 1;
  }
  sVar4 = ppVar13->el_info[0].res_level;
  if (sVar4 == -1) {
    borg.trait[0xbf] = 1;
  }
  sVar5 = ppVar13->el_info[3].res_level;
  if (sVar5 == -1) {
    borg.trait[0xbe] = 1;
  }
  sVar6 = ppVar13->el_info[1].res_level;
  if (sVar6 == -1) {
    borg.trait[0xbd] = 1;
  }
  if (sVar25 == 3) {
    borg.trait[0x40] = 1;
  }
  if (sVar4 == 3) {
    borg.trait[0x41] = 1;
  }
  if (sVar5 == 3) {
    borg.trait[0x42] = 1;
  }
  if (sVar6 == 3) {
    borg.trait[0x43] = 1;
  }
  if (0 < sVar25) {
    borg.trait[0x48] = 1;
  }
  if (0 < sVar6) {
    borg.trait[0x47] = 1;
  }
  if (0 < sVar25) {
    borg.trait[0x45] = 1;
  }
  if (0 < sVar5) {
    borg.trait[0x46] = 1;
  }
  if (0 < ppVar13->el_info[4].res_level) {
    borg.trait[0x49] = 1;
  }
  if (0 < ppVar13->el_info[5].res_level) {
    borg.trait[0x4b] = 1;
  }
  if (0 < ppVar13->el_info[6].res_level) {
    borg.trait[0x4c] = 1;
  }
  if (0 < ppVar13->el_info[7].res_level) {
    borg.trait[0x4f] = 1;
  }
  if (0 < ppVar13->el_info[8].res_level) {
    borg.trait[0x50] = 1;
  }
  if (0 < ppVar13->el_info[9].res_level) {
    borg.trait[0x51] = 1;
  }
  if (0 < ppVar13->el_info[10].res_level) {
    borg.trait[0x52] = 1;
  }
  if (0 < ppVar13->el_info[0xb].res_level) {
    borg.trait[0x53] = 1;
  }
  if (0 < ppVar13->el_info[0xc].res_level) {
    borg.trait[0x54] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,0xb,6,"f","OF_PROT_FEAR");
  if (_Var23) {
    borg.trait[0x4a] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,0xb,7,"f","OF_PROT_BLIND");
  if (_Var23) {
    borg.trait[0x4d] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,0xb,8,"f","OF_PROT_CONF");
  if (_Var23) {
    borg.trait[0x4e] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,0xb,1,"f","OF_SUST_STR");
  if (_Var23) {
    borg.trait[0x14] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,0xb,2,"f","OF_SUST_INT");
  if (_Var23) {
    borg.trait[0x15] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,0xb,3,"f","OF_SUST_WIS");
  if (_Var23) {
    borg.trait[0x16] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,0xb,4,"f","OF_SUST_DEX");
  if (_Var23) {
    borg.trait[0x17] = 1;
  }
  _Var23 = flag_has_dbg(local_7c,0xb,5,"f","OF_SUST_CON");
  if (_Var23) {
    borg.trait[0x18] = 1;
  }
  psVar14 = player->timed;
  iVar34 = 10;
  if (((*psVar14 != 0) || (psVar14[0x1d] != 0)) || (iVar34 = 5, psVar14[0x1c] != 0)) {
    borg.trait[0x2c] = borg.trait[0x2c] + iVar34;
  }
  piVar31 = borg.activation;
  pbVar33 = borg_items;
  paVar30 = z_info;
  uVar39 = (ulong)z_info->pack_size;
  lVar45 = uVar39 * 0x388;
  lVar42 = 0x6c;
  do {
    if ((long)*(int *)(pbVar33[uVar39].desc + lVar42) != 0) {
      piVar1 = piVar31 + *(int *)(pbVar33[uVar39].desc + lVar42);
      *piVar1 = *piVar1 + 1;
    }
    lVar42 = lVar42 + 0x388;
  } while (lVar42 != 0x2acc);
  if (piVar31[act_staff_magi] != 0) {
    borg.trait[0xdb] = borg.trait[0xdb] + 10;
  }
  local_6c = 0;
  local_70 = 0;
  do {
    piVar31 = borg.trait;
    pbVar33 = borg_items;
    if (borg_items->curses[lVar45 + -0x26] != false) {
      if (borg_items->curses[lVar45 + -1] == true) {
        borg.trait[0xa0] = borg.trait[0xa0] | 2;
        if (piVar31[0x9f] == 0) {
          piVar31[0x9f] = (int)uVar39 + 1;
        }
      }
      else if ((borg_items->curses[lVar45 + -0x22] == false) &&
              (borg_items->curses[lVar45 + -2] != false)) goto LAB_0024e08c;
      iVar24 = borg_item_weight((borg_item_conflict *)(pbVar33->desc + lVar45));
      borg.trait[0x104] = borg.trait[0x104] + (int)iVar24;
      _Var23 = borg_item_note_needs_id((borg_item_conflict *)(pbVar33->desc + lVar45));
      piVar31 = borg.trait;
      if (_Var23) {
        *(ulong *)(borg.trait + 0xfd) =
             CONCAT44((int)((ulong)*(undefined8 *)(borg.trait + 0xfd) >> 0x20) + 1,
                      (int)*(undefined8 *)(borg.trait + 0xfd) + 1);
      }
      poVar15 = player->obj_k;
      uVar47 = *(ulong *)((long)pbVar33->modifiers + lVar45);
      auVar19._8_4_ = 0;
      auVar19._0_8_ = uVar47;
      auVar19._12_2_ = (short)(uVar47 >> 0x30);
      auVar21._8_2_ = (short)(uVar47 >> 0x20);
      auVar21._0_8_ = uVar47;
      auVar21._10_4_ = auVar19._10_4_;
      auVar52._6_10_ = SUB1610(ZEXT616(auVar21._8_6_) << 0x40,6);
      auVar52._4_2_ = (short)(uVar47 >> 0x10);
      auVar52._0_2_ = (ushort)uVar47;
      auVar52._2_2_ = 0;
      uVar47 = *(ulong *)poVar15->modifiers;
      uVar54 = (undefined2)(uVar47 >> 0x30);
      auVar51._8_4_ = 0;
      auVar51._0_8_ = uVar47;
      auVar51._12_2_ = uVar54;
      auVar51._14_2_ = uVar54;
      uVar54 = (undefined2)(uVar47 >> 0x20);
      auVar50._12_4_ = auVar51._12_4_;
      auVar50._8_2_ = 0;
      auVar50._0_8_ = uVar47;
      auVar50._10_2_ = uVar54;
      auVar49._10_6_ = auVar50._10_6_;
      auVar49._8_2_ = uVar54;
      auVar49._0_8_ = uVar47;
      uVar54 = (undefined2)(uVar47 >> 0x10);
      auVar48._8_8_ = auVar49._8_8_;
      auVar48._6_2_ = uVar54;
      auVar48._4_2_ = uVar54;
      auVar48._0_2_ = (undefined2)uVar47;
      auVar48._2_2_ = auVar48._0_2_;
      auVar52 = pmaddwd(auVar48,auVar52);
      piVar31[5] = piVar31[5] + auVar52._0_4_;
      piVar31[6] = piVar31[6] + auVar52._4_4_;
      piVar31[7] = piVar31[7] + auVar52._8_4_;
      piVar31[8] = piVar31[8] + auVar52._12_4_;
      piVar31[9] = piVar31[9] +
                   (int)poVar15->modifiers[4] *
                   (int)*(short *)((long)pbVar33->modifiers + lVar45 + 8);
      piVar31[0xc1] = *(int *)((long)pbVar33->slays + lVar45 + 0xf0);
      piVar31[0xc2] = *(int *)((long)pbVar33->slays + lVar45 + 0xf4);
      piVar31[0xc3] = *(int *)((long)pbVar33->slays + lVar45 + 0xf8);
      piVar31[0xc4] = *(int *)((long)pbVar33->slays + lVar45 + 0xec);
      piVar31[0xc5] = *(int *)((long)pbVar33->slays + lVar45 + 0xdc);
      piVar31[0xc6] = *(int *)((long)pbVar33->slays + lVar45 + 0xe0);
      piVar31[199] = *(int *)((long)pbVar33->slays + lVar45 + 0xe4);
      piVar31[200] = *(int *)((long)pbVar33->slays + lVar45 + 0xe8);
      if (pbVar33->brands[lVar45] == true) {
        piVar31[0xcd] = 1;
      }
      if (pbVar33->brands[lVar45 + 1] == true) {
        piVar31[0xce] = 1;
      }
      if (pbVar33->brands[lVar45 + 2] == true) {
        piVar31[0xcf] = 1;
      }
      if (pbVar33->brands[lVar45 + 3] == true) {
        piVar31[0xd0] = 1;
      }
      if (pbVar33->brands[lVar45 + 4] == true) {
        piVar31[0xd1] = 1;
      }
      flags = pbVar33->flags + lVar45;
      _Var23 = flag_has_dbg(flags,5,0x11,"item->flags","OF_IMPACT");
      piVar31 = borg.trait;
      if (_Var23) {
        borg.trait[0xcc] = 1;
      }
      piVar31[0x34] = piVar31[0x34] + (int)*(short *)((long)pbVar33->modifiers + lVar45 + 0xe);
      piVar31[0x3a] = piVar31[0x3a] + (int)*(short *)((long)pbVar33->modifiers + lVar45 + 10);
      piVar31[0x3b] = piVar31[0x3b] + *(short *)((long)pbVar33->modifiers + lVar45 + 0xc) * 5;
      iVar34 = 0;
      if (pbVar33->curses[lVar45 + -0x2a] == true) {
        _Var23 = flag_has_dbg(flags,5,0x20,"item->flags","OF_DIG_1");
        iVar34 = 1;
        if (!_Var23) {
          _Var23 = flag_has_dbg(flags,5,0x21,"item->flags","OF_DIG_2");
          iVar34 = 2;
          if (!_Var23) {
            _Var23 = flag_has_dbg(flags,5,0x22,"item->flags","OF_DIG_3");
            iVar34 = (uint)_Var23 + (uint)_Var23 * 2;
          }
        }
      }
      piVar31 = borg.trait;
      borg.trait[0x3f] =
           borg.trait[0x3f] + (*(short *)((long)pbVar33->modifiers + lVar45 + 0x10) + iVar34) * 0x14
      ;
      piVar31[0x2c] = piVar31[0x2c] + (int)*(short *)((long)pbVar33->modifiers + lVar45 + 0x12);
      if (uVar39 != z_info->pack_size) {
        piVar31[0x93] = piVar31[0x93] + (int)*(short *)((long)pbVar33->modifiers + lVar45 + 0x14);
      }
      local_58 = (int)*(short *)((long)pbVar33->modifiers + lVar45 + 0x16);
      local_54 = (int)*(short *)((long)pbVar33->modifiers + lVar45 + 0x18);
      piVar31[0x1a] = piVar31[0x1a] + (int)*(short *)((long)pbVar33->modifiers + lVar45 + 0x1a);
      _Var23 = flag_has_dbg(flags,5,0x1e,"item->flags","OF_LIGHT_2");
      iVar34 = 2;
      if (_Var23) {
LAB_0024d440:
        borg.trait[0x1a] = borg.trait[0x1a] + iVar34;
      }
      else {
        _Var23 = flag_has_dbg(flags,5,0x1f,"item->flags","OF_LIGHT_3");
        iVar34 = 3;
        if (_Var23) goto LAB_0024d440;
      }
      sVar25 = *(short *)((long)pbVar33->modifiers + lVar45 + 0x1a);
      if ((0 < sVar25) && (borg.trait[0x19] == 4)) {
        borg.trait[0x1a] = borg.trait[0x1a] + -1;
      }
      if (uVar39 == (ulong)z_info->pack_size + 5) {
        if (*(short *)(pbVar33->curses + lVar45 + -0x18) == 0) {
          _Var23 = flag_has_dbg(flags,5,0x15,"item->flags","OF_NO_FUEL");
          if (!_Var23) goto LAB_0024d4bc;
          sVar25 = *(short *)((long)pbVar33->modifiers + lVar45 + 0x1a);
        }
        borg.trait[0x1a] = borg.trait[0x1a] + (int)sVar25;
      }
LAB_0024d4bc:
      piVar31 = borg.trait;
      auVar52 = ZEXT416(*(uint *)((long)pbVar33->modifiers + lVar45 + 0x1c));
      auVar52 = pshuflw(auVar52,auVar52,4);
      uVar32 = *(undefined8 *)(borg.trait + 0x2e);
      borg.trait[0x2e] = (int)uVar32 + (auVar52._0_4_ >> 0x10);
      piVar31[0x2f] = (int)((ulong)uVar32 >> 0x20) + (auVar52._4_4_ >> 0x10);
      _Var23 = flag_has_dbg(flags,5,10,"item->flags","OF_SLOW_DIGEST");
      if (_Var23) {
        borg.trait[0x30] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,0x1a,"item->flags","OF_AGGRAVATE");
      if (_Var23) {
        borg.trait[0xae] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,0x16,"item->flags","OF_IMPAIR_HP");
      if (_Var23) {
        borg.trait[0xb6] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,0x17,"item->flags","OF_IMPAIR_MANA");
      if (_Var23) {
        borg.trait[0xb7] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,0x18,"item->flags","OF_AFRAID");
      if (_Var23) {
        borg.trait[0xba] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,0x1b,"item->flags","OF_DRAIN_EXP");
      if (_Var23) {
        borg.trait[0xbb] = 1;
      }
      if (pbVar33->curses[lVar45 + 1] == true) {
        borg.trait[0xaf] = 1;
      }
      if (pbVar33->curses[lVar45 + 2] == true) {
        borg.trait[0xa3] = 1;
      }
      if (pbVar33->curses[lVar45 + 3] == true) {
        borg.trait[0xb0] = 1;
      }
      if (pbVar33->curses[lVar45 + 4] == true) {
        borg.trait[0xb1] = 1;
      }
      if (pbVar33->curses[lVar45 + 5] == true) {
        borg.trait[0xa1] = 1;
      }
      piVar31 = borg.trait;
      if (pbVar33->curses[lVar45 + 6] == true) {
        borg.trait[0xae] = 1;
        piVar31[0xa2] = 1;
      }
      if (pbVar33->curses[lVar45 + 7] == true) {
        borg.trait[0xb2] = 1;
      }
      if (pbVar33->curses[lVar45 + 8] == true) {
        borg.trait[0xb3] = 1;
      }
      if (pbVar33->curses[lVar45 + 9] == true) {
        borg.trait[0xb4] = 1;
      }
      if (pbVar33->curses[lVar45 + 10] == true) {
        borg.trait[0xb5] = 1;
      }
      if (pbVar33->curses[lVar45 + 0xb] == true) {
        borg.trait[0xa4] = 1;
      }
      if (pbVar33->curses[lVar45 + 0xc] == true) {
        borg.trait[0xa5] = 1;
      }
      if (pbVar33->curses[lVar45 + 0xd] == true) {
        borg.trait[0xa6] = 1;
      }
      if (pbVar33->curses[lVar45 + 0xe] == true) {
        borg.trait[0xa7] = 1;
      }
      if (pbVar33->curses[lVar45 + 0x10] == true) {
        borg.trait[0xa8] = 1;
      }
      if (pbVar33->curses[lVar45 + 0xf] == true) {
        borg.trait[0xa9] = 1;
      }
      if (pbVar33->curses[lVar45 + 0x11] == true) {
        borg.trait[0xaa] = 1;
      }
      if (pbVar33->curses[lVar45 + 0x12] == true) {
        borg.trait[0xb7] = 1;
      }
      if (pbVar33->curses[lVar45 + 0x13] == true) {
        borg.trait[0xb6] = 1;
      }
      if (pbVar33->curses[lVar45 + 0x14] == true) {
        borg.trait[0xba] = 1;
      }
      if (pbVar33->curses[lVar45 + 0x15] == true) {
        borg.trait[0xab] = 1;
      }
      if (pbVar33->curses[lVar45 + 0x16] == true) {
        borg.trait[0xac] = 1;
      }
      if (pbVar33->curses[lVar45 + 0x17] == true) {
        borg.trait[0xad] = 1;
      }
      piVar31 = borg.trait;
      if (pbVar33->curses[lVar45 + 0x18] == true) {
        borg.trait[0xbc] = 1;
        piVar31[0x46] = 1;
      }
      piVar31 = borg.trait;
      if (pbVar33->curses[lVar45 + 0x19] == true) {
        borg.trait[0xbe] = 1;
        piVar31[0x45] = 1;
      }
      if (pbVar33->curses[lVar45 + 0x1a] == true) {
        borg.trait[0xb8] = 1;
      }
      if (pbVar33->curses[lVar45 + 0x1b] == true) {
        borg.trait[0xb9] = 1;
      }
      if (pbVar33->curses[lVar45] == true) {
        borg.trait[0xc0] = 1;
      }
      if (*(short *)((long)&pbVar33->el_info[2].res_level + lVar45) == -1) {
        borg.trait[0xbc] = 1;
      }
      if (*(short *)((long)&pbVar33->el_info[0].res_level + lVar45) == -1) {
        borg.trait[0xbf] = 1;
      }
      if (*(short *)((long)&pbVar33->el_info[3].res_level + lVar45) == -1) {
        borg.trait[0xbe] = 1;
      }
      if (*(short *)((long)&pbVar33->el_info[1].res_level + lVar45) == -1) {
        borg.trait[0xbd] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,0xc,"item->flags","OF_REGEN");
      if (_Var23) {
        borg.trait[0x32] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,0xd,"item->flags","OF_TELEPATHY");
      if (_Var23) {
        borg.trait[0x25] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,0xe,"item->flags","OF_SEE_INVIS");
      if (_Var23) {
        borg.trait[0x33] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,0xb,"item->flags","OF_FEATHER");
      if (_Var23) {
        borg.trait[0x31] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,0xf,"item->flags","OF_FREE_ACT");
      if (_Var23) {
        borg.trait[0x56] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,0x10,"item->flags","OF_HOLD_LIFE");
      if (_Var23) {
        borg.trait[0x55] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,8,"item->flags","OF_PROT_CONF");
      if (_Var23) {
        borg.trait[0x4e] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,7,"item->flags","OF_PROT_BLIND");
      if (_Var23) {
        borg.trait[0x4d] = 1;
      }
      piVar31 = borg.trait;
      sVar25 = *(short *)((long)&pbVar33->el_info[2].res_level + lVar45);
      if (sVar25 == 3) {
        borg.trait[0x40] = 1;
        piVar31[0x45] = 1;
        borg.temp.res_fire = true;
      }
      piVar31 = borg.trait;
      sVar4 = *(short *)((long)&pbVar33->el_info[0].res_level + lVar45);
      if (sVar4 == 3) {
        borg.trait[0x41] = 1;
        piVar31[0x48] = 1;
        borg.temp.res_acid = true;
      }
      piVar31 = borg.trait;
      sVar5 = *(short *)((long)&pbVar33->el_info[3].res_level + lVar45);
      if (sVar5 == 3) {
        borg.trait[0x42] = 1;
        piVar31[0x46] = 1;
        borg.temp.res_cold = true;
      }
      piVar31 = borg.trait;
      sVar6 = *(short *)((long)&pbVar33->el_info[1].res_level + lVar45);
      if (sVar6 == 3) {
        borg.trait[0x43] = 1;
        piVar31[0x47] = 1;
        borg.temp.res_elec = true;
      }
      if (0 < sVar4) {
        borg.trait[0x48] = 1;
      }
      if (0 < sVar6) {
        borg.trait[0x47] = 1;
      }
      if (0 < sVar25) {
        borg.trait[0x45] = 1;
      }
      if (0 < sVar5) {
        borg.trait[0x46] = 1;
      }
      if (0 < *(short *)((long)&pbVar33->el_info[4].res_level + lVar45)) {
        borg.trait[0x49] = 1;
      }
      if (0 < *(short *)((long)&pbVar33->el_info[7].res_level + lVar45)) {
        borg.trait[0x4f] = 1;
      }
      if (0 < *(short *)((long)&pbVar33->el_info[5].res_level + lVar45)) {
        borg.trait[0x4b] = 1;
      }
      if (0 < *(short *)((long)&pbVar33->el_info[6].res_level + lVar45)) {
        borg.trait[0x4c] = 1;
      }
      if (0 < *(short *)((long)&pbVar33->el_info[0xb].res_level + lVar45)) {
        borg.trait[0x53] = 1;
      }
      if (0 < *(short *)((long)&pbVar33->el_info[0xc].res_level + lVar45)) {
        borg.trait[0x54] = 1;
      }
      if (0 < *(short *)((long)&pbVar33->el_info[8].res_level + lVar45)) {
        borg.trait[0x50] = 1;
      }
      if (0 < *(short *)((long)&pbVar33->el_info[9].res_level + lVar45)) {
        borg.trait[0x51] = 1;
      }
      if (0 < *(short *)((long)&pbVar33->el_info[10].res_level + lVar45)) {
        borg.trait[0x52] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,1,"item->flags","OF_SUST_STR");
      if (_Var23) {
        borg.trait[0x14] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,2,"item->flags","OF_SUST_INT");
      if (_Var23) {
        borg.trait[0x15] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,3,"item->flags","OF_SUST_WIS");
      if (_Var23) {
        borg.trait[0x16] = 1;
      }
      _Var23 = flag_has_dbg(flags,5,4,"item->flags","OF_SUST_DEX");
      if (_Var23) {
        borg.trait[0x17] = 1;
      }
      local_38 = uVar39;
      _Var23 = flag_has_dbg(flags,5,5,"item->flags","OF_SUST_CON");
      if (_Var23) {
        borg.trait[0x18] = 1;
      }
      local_74 = 0 < *(short *)((long)&pbVar33->el_info[4].res_level + lVar45);
      local_76 = 0 < *(short *)((long)&pbVar33->el_info[7].res_level + lVar45);
      local_75 = 0 < *(short *)((long)&pbVar33->el_info[8].res_level + lVar45);
      local_77 = 0 < *(short *)((long)&pbVar33->el_info[9].res_level + lVar45);
      local_71 = 0 < *(short *)((long)&pbVar33->el_info[10].res_level + lVar45);
      local_73 = 0 < *(short *)((long)&pbVar33->el_info[0xb].res_level + lVar45);
      local_72 = 0 < *(short *)((long)&pbVar33->el_info[0xc].res_level + lVar45);
      local_5c = 0;
      if (((0 < *(short *)((long)&pbVar33->el_info[2].res_level + lVar45)) &&
          (0 < *(short *)((long)&pbVar33->el_info[3].res_level + lVar45))) &&
         (0 < *(short *)((long)&pbVar33->el_info[1].res_level + lVar45))) {
        local_5c = (uint)(0 < *(short *)((long)&pbVar33->el_info[0].res_level + lVar45));
      }
      local_68 = flags;
      _Var23 = flag_has_dbg(flags,5,1,"item->flags","OF_SUST_STR");
      if (((_Var23) && (_Var23 = flag_has_dbg(local_68,5,2,"item->flags","OF_SUST_INT"), _Var23)) &&
         (_Var23 = flag_has_dbg(local_68,5,3,"item->flags","OF_SUST_WIS"), _Var23)) {
        _Var23 = flag_has_dbg(local_68,5,4,"item->flags","OF_SUST_DEX");
        uVar46 = 0;
        if (_Var23) {
          _Var23 = flag_has_dbg(local_68,5,5,"item->flags","OF_SUST_CON");
          uVar46 = (uint)_Var23;
        }
      }
      else {
        uVar46 = 0;
      }
      uVar46 = (uint)local_72 + (uint)local_73 + (uint)local_71 +
               (uint)local_77 + (uint)local_75 + (uint)local_76 + (uint)local_74 + local_5c + uVar46
      ;
      if (2 < uVar46) {
        borg.trait[0x102] = borg.trait[0x102] + uVar46;
      }
      if (((pbVar33->curses[lVar45 + -0x22] == false) && (pbVar33->curses[lVar45 + -0x21] == false))
         && ((sVar25 = *(short *)(pbVar33->curses + lVar45 + -0x10), 0 < sVar25 &&
             (iVar34 = (int)*(short *)(pbVar33->curses + lVar45 + -0x12) + (int)sVar25,
             iVar34 == 0 ||
             SCARRY4((int)*(short *)(pbVar33->curses + lVar45 + -0x12),(int)sVar25) != iVar34 < 0)))
         ) {
        (pbVar33->curses + lVar45 + -0x12)[0] = true;
        (pbVar33->curses + lVar45 + -0x12)[1] = true;
      }
      piVar31 = borg.trait;
      local_6c = local_6c + local_58;
      local_70 = local_70 + local_54;
      borg.trait[0x85] =
           (int)*(short *)(pbVar33->curses + lVar45 + -0x12) +
           (int)*(short *)(pbVar33->curses + lVar45 + -0x10) + borg.trait[0x85];
      paVar30 = z_info;
      uVar39 = local_38;
      if ((local_38 != z_info->pack_size) && (local_38 != (ulong)z_info->pack_size + 1)) {
        auVar52 = pshuflw(ZEXT416(*(uint *)(pbVar33->curses + lVar45 + -0x16)),
                          ZEXT416(*(uint *)(pbVar33->curses + lVar45 + -0x16)),0x60);
        uVar32 = *(undefined8 *)(piVar31 + 0x86);
        piVar31[0x86] = (int)uVar32 + (auVar52._0_4_ >> 0x10);
        piVar31[0x87] = (int)((ulong)uVar32 >> 0x20) + (auVar52._4_4_ >> 0x10);
      }
    }
LAB_0024e08c:
    piVar31 = borg.trait;
    uVar39 = uVar39 + 1;
    lVar45 = lVar45 + 0x388;
  } while (uVar39 < (ulong)paVar30->pack_size + 0xc);
  if ((borg.trait[0x19] == 4) && (borg.trait[0x1a] < 1)) {
    borg.trait[0x1a] = 1;
  }
  if (piVar31[0xaf] != 0) {
    piVar31[0xae] = 1;
    piVar31[0x85] = piVar31[0x85] + -0x32;
  }
  if (piVar31[0xb0] != 0) {
    *(ulong *)(piVar31 + 0xb) =
         CONCAT44((int)((ulong)*(undefined8 *)(piVar31 + 0xb) >> 0x20) + -5,
                  (int)*(undefined8 *)(piVar31 + 0xb) + -5);
  }
  if (piVar31[0xb1] != 0) {
    piVar31[10] = piVar31[10] + -5;
    *(ulong *)(piVar31 + 0xd) =
         CONCAT44((int)((ulong)*(undefined8 *)(piVar31 + 0xd) >> 0x20) + -5,
                  (int)*(undefined8 *)(piVar31 + 0xd) + -5);
  }
  if (piVar31[0xb2] != 0) {
    piVar31[10] = piVar31[10] + -10;
  }
  if (piVar31[0xb3] != 0) {
    piVar31[0xd] = piVar31[0xd] + -10;
  }
  if (piVar31[0xb4] != 0) {
    piVar31[0x2c] = piVar31[0x2c] + -5;
  }
  if (piVar31[0xb5] != 0) {
    piVar31[0x2c] = piVar31[0x2c] + -10;
    piVar31[0x3a] = piVar31[0x3a] + -10;
    piVar31[0xae] = 1;
  }
  local_50 = *(undefined8 *)player->stat_cur;
  local_48 = player->stat_cur[4];
  lVar42 = 0;
  do {
    sVar25 = *(short *)((long)&local_50 + lVar42);
    uVar26 = modify_stat_value((int)sVar25,
                               *(int *)((long)player->race->r_adj + lVar42 * 2) +
                               *(int *)((long)piVar31 + lVar42 * 2 + 0x14) +
                               *(int *)((long)player->class->c_adj + lVar42 * 2));
    piVar31 = borg.trait;
    iVar34 = (int)(short)uVar26;
    if ((short)uVar26 < 0x13) {
      iVar41 = iVar34 + -3;
    }
    else {
      iVar41 = 0x25;
      if (uVar26 < 0xee) {
        iVar41 = (iVar34 - 0x12U) / 10 + 0xf;
      }
    }
    *(int *)((long)borg.trait + lVar42 * 2 + 0x3c) = iVar41;
    *(int *)((long)piVar31 + lVar42 * 2) = iVar34;
    *(int *)((long)piVar31 + lVar42 * 2 + 0x28) = (int)sVar25;
    lVar42 = lVar42 + 2;
  } while (lVar42 != 10);
  piVar31[0x1d] =
       (piVar31[0x23] * borg_adj_con_mhp[piVar31[0x13]]) / 100 +
       (int)player->player_hp[(long)player->lev + -1];
  wVar27 = borg_spell_stat();
  piVar31 = borg.trait;
  if (L'\xffffffff' < wVar27) {
    borg.trait[0x20] =
         (((borg.trait[0x23] - (player->class->magic).spell_first) + 1) *
         borg_adj_mag_mana[borg.trait[(ulong)(uint)wVar27 + 0xf]]) / 2;
    piVar31[0x21] = borg_adj_mag_stat[piVar31[(ulong)(uint)wVar27 + 0xf]];
    piVar31[0x22] = borg_adj_mag_fail[piVar31[(ulong)(uint)wVar27 + 0xf]];
  }
  if (piVar31[0x6f] != 0) {
    piVar31[0x2c] = piVar31[0x2c] + -10;
  }
  piVar31[0x85] = piVar31[0x85] + borg_adj_dex_ta[piVar31[0x12]];
  iVar34 = piVar31[0xf];
  piVar31[0x87] = piVar31[0x87] + borg_adj_str_td[iVar34];
  iVar38 = piVar31[0x86] + borg_adj_dex_th[piVar31[0x12]] + borg_adj_str_th[iVar34];
  piVar31[0x86] = iVar38;
  iVar41 = adj_str_hold[iVar34];
  piVar31[0x3f] = piVar31[0x3f] + borg_adj_str_dig[iVar34];
  pbVar33 = borg_items;
  uVar39 = (ulong)z_info->pack_size;
  uVar2 = borg_items[uVar39 + 1].iqty;
  bVar43 = borg_items[uVar39 + 1].art_idx;
  if (uVar2 == '\0') {
LAB_0024e3a2:
    pbVar36 = borg_items + uVar39 + 1;
    pbVar36->dd = '\0';
    pbVar36->ds = '\0';
    pbVar33[uVar39 + 1].to_h = 0;
    pbVar33[uVar39 + 1].to_d = 0;
    pbVar33[uVar39 + 1].weight = 0;
    pbVar33[uVar39 + 1].ident = true;
    pbVar33[uVar39 + 1].sval = '\0';
    bVar44 = bVar43;
  }
  else {
    bVar44 = bVar43;
    if (bVar43 == 0) {
      if (borg_items[uVar39 + 1].uncursable == false) {
        bVar43 = 0;
        bVar44 = 0;
        if (borg_items[uVar39 + 1].cursed == true) goto LAB_0024e3a2;
      }
      else {
        bVar44 = 0;
      }
    }
  }
  piVar31[0x8e] = (int)pbVar33[uVar39 + 1].to_h;
  piVar31[0x8f] = (int)pbVar33[uVar39 + 1].to_d;
  piVar31[0x8d] = (uint)pbVar33[uVar39 + 1].ident;
  wVar27 = sv_sling;
  bVar43 = pbVar33[uVar39 + 1].sval;
  piVar31[0x90] = (uint)(sv_sling == (uint)bVar43);
  piVar31[0x91] = (uint)bVar44;
  iVar34 = (int)pbVar33[uVar39 + 1].weight / 10;
  if (iVar41 < iVar34) {
    piVar31[0x96] = 1;
    piVar31[0x86] = iVar38 + (iVar41 - iVar34) * 2;
LAB_0024e477:
    iVar38 = 1;
  }
  else {
    if (uVar2 == '\0') goto LAB_0024e477;
    if (wVar27 == (uint)bVar43) {
      uVar32 = 0x300000002;
LAB_0024e49b:
      *(undefined8 *)(piVar31 + 0x98) = uVar32;
      iVar34 = 2;
    }
    else {
      wVar27 = (wchar_t)bVar43;
      if (sv_short_bow == wVar27) {
        uVar32 = 0x400000003;
        goto LAB_0024e49b;
      }
      if (sv_long_bow == wVar27) {
        uVar32 = 0x400000003;
LAB_002506e9:
        *(undefined8 *)(piVar31 + 0x98) = uVar32;
        iVar34 = 3;
      }
      else {
        if (sv_light_xbow == wVar27) {
          uVar32 = 0x500000004;
          goto LAB_002506e9;
        }
        if (sv_heavy_xbow == wVar27) {
          piVar31[0x98] = 4;
          piVar31[0x99] = 5;
          iVar34 = 4;
        }
        else {
          iVar34 = piVar31[0x9a];
        }
      }
    }
    piVar31[0x9a] = iVar34 + local_70;
    _Var23 = flag_has_dbg((player->state).pflags,3,1,"player->state.pflags","(PF_FAST_SHOT)");
    piVar31 = borg.trait;
    iVar34 = 1;
    if (_Var23) {
      iVar34 = (uint)(0x13 < borg.trait[0x23] && borg.trait[0x98] == 3) +
               (uint)(0x27 < borg.trait[0x23]) + 1;
      borg.trait[0x35] = 1;
    }
    iVar38 = 1;
    if (1 < iVar34 + local_6c) {
      iVar38 = iVar34 + local_6c;
    }
    uVar39 = (ulong)z_info->pack_size;
    pbVar33 = borg_items;
  }
  piVar31[0x94] = iVar38;
  item = (borg_item *)(pbVar33 + uVar39);
  uVar2 = pbVar33[uVar39].iqty;
  if ((uVar2 == '\0') ||
     (((item->art_idx == '\0' && (item->uncursable == false)) && (item->cursed == true)))) {
    item->dd = '\0';
    item->ds = '\0';
    item->to_h = 0;
    item->to_d = 0;
    item->weight = 0;
    item->ident = true;
  }
  piVar31[0x88] = (int)item->to_h;
  piVar31[0x89] = (int)item->to_d;
  piVar31[0x8a] = (uint)item->ident;
  uVar46._0_1_ = item->dd;
  uVar46._1_1_ = item->ds;
  uVar46._2_1_ = item->level;
  uVar46._3_1_ = item->field_0x7f;
  auVar17[0xc] = uVar46._3_1_;
  auVar17._0_12_ = ZEXT712(0);
  auVar20[1] = 0;
  auVar20[0] = uVar46._2_1_;
  auVar20._2_3_ = auVar17._10_3_;
  auVar20._5_8_ = 0;
  auVar18[5] = 0;
  auVar18[4] = uVar46._1_1_;
  auVar18._6_7_ = SUB137(auVar20 << 0x40,6);
  auVar18._0_4_ = uVar46 & 0xff;
  *(long *)(piVar31 + 0x8b) = auVar18._0_8_;
  iVar34 = (int)item->weight / 10;
  if (iVar41 < iVar34) {
    piVar31[0x95] = 1;
    iVar34 = (iVar41 - iVar34) * 2;
    lVar42 = 0x218;
LAB_0024e61f:
    *(int *)((long)piVar31 + lVar42) = *(int *)((long)piVar31 + lVar42) + iVar34;
  }
  else if (uVar2 != '\0') {
    wVar27 = borg_calc_blows(item);
    piVar31[0x92] = wVar27;
    lVar42 = 0xfc;
    goto LAB_0024e61f;
  }
  _Var23 = flag_has_dbg((player->state).pflags,3,2,"player->state.pflags","(PF_BRAVERY_30)");
  piVar31 = borg.trait;
  if ((_Var23) && (0x1d < borg.trait[0x23])) {
    borg.trait[0x4a] = 1;
  }
  iVar34 = piVar31[0x3a];
  piVar31[0x3a] = iVar34 + 1;
  iVar41 = piVar31[0x24];
  iVar38 = piVar31[0x36];
  iVar40 = borg_adj_dex_dis[piVar31[0x12]];
  piVar31[0x36] = iVar38 + iVar40;
  iVar7 = piVar31[0x37];
  iVar8 = borg_adj_dex_dis[piVar31[0x10]];
  piVar31[0x37] = iVar7 + iVar8;
  iVar9 = piVar31[0x38];
  iVar10 = borg_adj_int_dev[piVar31[0x10]];
  piVar31[0x38] = iVar9 + iVar10;
  iVar11 = piVar31[0x39];
  iVar12 = borg_adj_wis_sav[piVar31[0x11]];
  piVar31[0x39] = iVar11 + iVar12;
  piVar31[0x36] = (local_40->x_skills[0] * iVar41) / 10 + iVar38 + iVar40;
  piVar31[0x37] = (local_40->x_skills[1] * iVar41) / 10 + iVar7 + iVar8;
  iVar38 = (local_40->x_skills[2] * iVar41) / 10 + iVar9 + iVar10;
  piVar31[0x38] = iVar38;
  piVar31[0x39] = (local_40->x_skills[3] * iVar41) / 10 + iVar11 + iVar12;
  iVar40 = iVar34 + (local_40->x_skills[5] * iVar41) / 10 + 1;
  piVar31[0x3a] = iVar40;
  piVar31[0x3b] = piVar31[0x3b] + (local_40->x_skills[4] * iVar41) / 10;
  piVar31[0x3c] = piVar31[0x3c] + (local_40->x_skills[6] * iVar41) / 10;
  piVar31[0x3d] = piVar31[0x3d] + (local_40->x_skills[7] * iVar41) / 10;
  piVar31[0x3e] = piVar31[0x3e] + (iVar41 * local_40->x_skills[8]) / 10;
  iVar34 = 0x1e;
  if (iVar40 < 0x1f) {
    if (iVar40 < 0) {
      iVar34 = 0;
      goto LAB_0024e870;
    }
  }
  else {
LAB_0024e870:
    piVar31[0x3a] = iVar34;
  }
  if (piVar31[0x3f] < 1) {
    piVar31[0x3f] = 1;
  }
  if ((piVar31[0x71] != 0) || (piVar31[0xba] != 0)) {
    *(ulong *)(piVar31 + 0x85) =
         CONCAT44((int)((ulong)*(undefined8 *)(piVar31 + 0x85) >> 0x20) + -0x14,
                  (int)*(undefined8 *)(piVar31 + 0x85) + 8);
    piVar31[0x38] = (iVar38 * 0x5f) / 100;
  }
  _Var23 = flag_has_dbg((player->state).pflags,3,3,"player->state.pflags","(PF_BLESS_WEAPON)");
  if ((_Var23) &&
     ((item->tval == '\a' ||
      (_Var23 = flag_has_dbg(item->flags,5,0x12,"item->flags","OF_BLESSED"), _Var23)))) {
    piVar31 = borg.trait;
    uVar32 = *(undefined8 *)(borg.trait + 0x86);
    borg.trait[0x86] = (int)uVar32 + 2;
    piVar31[0x87] = (int)((ulong)uVar32 >> 0x20) + 2;
  }
  uVar26 = z_info->pack_size;
  lVar42 = (ulong)uVar26 * 0x388 + 0x89;
  pbVar33 = borg_items;
  uVar39 = (ulong)uVar26;
  do {
    pbVar36 = pbVar33;
    if ((((pbVar33->desc[lVar42 + -0x25] != '\0') && (pbVar33->desc[lVar42 + -0x2d] == '\x01')) &&
        ((pbVar33->desc[lVar42 + -0x21] != '\0' ||
         ((pbVar33->desc[lVar42] != '\0' || (pbVar33->desc[lVar42 + -1] == '\0')))))) &&
       ((uVar39 != (ulong)uVar26 + 1 ||
        (((pbVar33->desc[lVar42 + -0x21] != '\0' || (2 < borg.trait[0x9a])) ||
         (pbVar33->desc[lVar42 + -0x20] != '\0')))))) {
      _Var23 = borg_spell_legal_fail(ENCHANT_WEAPON,L'A');
      piVar1 = borg_cfg;
      piVar31 = borg.trait;
      pbVar36 = borg_items;
      if ((_Var23) || (0 < borg.trait[0xec])) {
        iVar34 = borg_cfg[0x1c];
        iVar41 = iVar34 - *(short *)(pbVar33->desc + lVar42 + -0x15);
        if (iVar41 != 0 && *(short *)(pbVar33->desc + lVar42 + -0x15) <= iVar34) {
          borg.trait[0xf1] = borg.trait[0xf1] + iVar41;
          iVar34 = piVar1[0x1c];
        }
        iVar41 = iVar34 - *(short *)(pbVar33->desc + lVar42 + -0x13);
        if (iVar41 != 0 && *(short *)(pbVar33->desc + lVar42 + -0x13) <= iVar34) {
          borg.trait[0xf2] = borg.trait[0xf2] + iVar41;
        }
      }
      else {
        if (*(short *)(pbVar33->desc + lVar42 + -0x15) < 8) {
          borg.trait[0xf1] =
               (borg.trait[0xf1] - (int)*(short *)(pbVar33->desc + lVar42 + -0x15)) + 8;
        }
        if (*(short *)(pbVar33->desc + lVar42 + -0x13) < 8) {
          piVar31[0xf2] = (piVar31[0xf2] - (int)*(short *)(pbVar33->desc + lVar42 + -0x13)) + 8;
        }
      }
    }
    uVar26 = z_info->pack_size;
    uVar47 = (ulong)uVar26;
    lVar42 = lVar42 + 0x388;
    bVar16 = uVar39 <= uVar47;
    pbVar33 = pbVar36;
    uVar39 = uVar39 + 1;
  } while (bVar16);
  uVar39 = uVar47 + 5;
  lVar42 = uVar47 * 0x388 + 0x15b9;
  do {
    if (((pbVar36->desc[lVar42 + -0x25] != '\0') && (pbVar36->desc[lVar42 + -0x2d] == '\x01')) &&
       ((pbVar36->desc[lVar42 + -0x21] != '\0' ||
        ((pbVar36->desc[lVar42] != '\0' || (pbVar36->desc[lVar42 + -1] == '\0')))))) {
      _Var23 = borg_spell_legal_fail(ENCHANT_ARMOUR,L'A');
      pbVar33 = borg_items;
      if ((_Var23) || (0 < borg.trait[0xee])) {
        pcVar22 = pbVar36->desc;
        iVar34 = borg_cfg[0x1c] - (int)*(short *)(pcVar22 + lVar42 + -0x11);
        pbVar36 = pbVar33;
        if (iVar34 != 0 && (int)*(short *)(pcVar22 + lVar42 + -0x11) <= borg_cfg[0x1c]) {
          borg.trait[0xf0] = borg.trait[0xf0] + iVar34;
        }
      }
      else {
        pcVar22 = pbVar36->desc;
        pbVar36 = pbVar33;
        if (*(short *)(pcVar22 + lVar42 + -0x11) < 8) {
          borg.trait[0xf0] = (borg.trait[0xf0] - (int)*(short *)(pcVar22 + lVar42 + -0x11)) + 8;
        }
      }
    }
    piVar31 = borg.trait;
    uVar39 = uVar39 + 1;
    lVar42 = lVar42 + 0x388;
  } while (uVar39 < (ulong)z_info->pack_size + 0xb);
  if (0 < borg.see_inv) {
    borg.trait[0x33] = 1;
  }
  if ((piVar31[0x69] == 0) &&
     (_Var23 = borg_spell_legal(SENSE_INVISIBLE), piVar31 = borg.trait, _Var23)) {
    borg.trait[0x33] = 1;
  }
  if (((99 < piVar31[0x39]) && (piVar31[0x56] = 1, piVar31[0x4c] != 0)) && (piVar31[0x4b] != 0)) {
    piVar31[0x4d] = 1;
  }
  if (z_info->quiver_size != 0) {
    wVar27 = (uint)z_info->pack_size + L'\f';
    do {
      borg_notice_ammo(wVar27);
      wVar27 = wVar27 + L'\x01';
      piVar31 = borg.trait;
    } while ((uint)wVar27 < (uint)((uint)z_info->pack_size + (uint)z_info->quiver_size + L'\f'));
  }
  borg.need_statgain[0] = false;
  borg.need_statgain[1] = false;
  borg.need_statgain[2] = false;
  borg.need_statgain[3] = false;
  borg.need_statgain[4] = false;
  borg.amt_statgain[4] = 0;
  borg.amt_statgain[0] = 0;
  borg.amt_statgain[1] = 0;
  borg.amt_statgain[2] = 0;
  borg.amt_statgain[3] = 0;
  borg.amt_book[0] = 0;
  borg.amt_book[1] = 0;
  borg.amt_book[2] = 0;
  borg.amt_book[3] = 0;
  borg.amt_book[4] = 0;
  borg.amt_book[5] = 0;
  borg.amt_book[6] = 0;
  borg.amt_book[7] = 0;
  borg.amt_book[8] = 0;
  if (piVar31[0x9e] < (int)(uint)z_info->pack_size) {
    lVar45 = 0;
    lVar42 = 0;
    do {
      pbVar33 = borg_items;
      if (borg_items->curses[lVar45 + -0x26] == false) {
        piVar31[0x106] = piVar31[0x106] + 1;
      }
      else {
        _Var23 = borg_is_ammo((uint)borg_items->curses[lVar45 + -0x2a]);
        if (_Var23) {
          borg_notice_ammo((wchar_t)lVar42);
        }
        else {
          iVar24 = borg_item_weight((borg_item_conflict *)(pbVar33->desc + lVar45));
          borg.trait[0x104] = borg.trait[0x104] + (int)iVar24;
          _Var23 = borg_item_note_needs_id((borg_item_conflict *)(pbVar33->desc + lVar45));
          if (_Var23) {
            borg.trait[0xfe] = borg.trait[0xfe] + 1;
          }
          piVar31 = borg.trait;
          _Var23 = pbVar33->curses[lVar45 + -1];
          if ((_Var23 == true) && (borg.trait[0xa0] = borg.trait[0xa0] | 1, piVar31[0x9f] == 0)) {
            piVar31[0x9f] = (wchar_t)lVar42 + L'\x01';
          }
          if (pbVar33->curses[lVar45 + -0x2c] == true) {
            _Var3 = pbVar33->curses[lVar45 + -0x26];
            uVar46 = (uint)_Var3;
            borg.has[*(uint *)(pbVar33->curses + lVar45 + -0x32)] =
                 borg.has[*(uint *)(pbVar33->curses + lVar45 + -0x32)] + (uint)_Var3;
            piVar31 = borg.trait;
            if ((((_Var3 == 0) || (pbVar33->curses[lVar45 + -0x22] != false || _Var23 != false)) ||
                (pbVar33->curses[lVar45 + -2] == false)) &&
               (pbVar33->curses[lVar45 + -0x2a] - 6 < 0x1d)) {
              uVar28 = (uint)_Var3;
              uVar29 = (uint)_Var3;
              switch((uint)pbVar33->curses[lVar45 + -0x2a]) {
              case 6:
                if (((0 < *(int *)(pbVar33->curses + lVar45 + -6)) &&
                    (pbVar33->curses[lVar45 + -2] == false)) && (0xc < borg.trait[0x3f])) {
                  borg.trait[0xff] = borg.trait[0xff] + (uint)_Var3;
                }
                break;
              case 0x13:
                if ((((sv_light_torch == (uint)pbVar33->curses[lVar45 + -0x29]) &&
                     (0 < *(short *)(pbVar33->curses + lVar45 + -0x18))) &&
                    (pbVar33->curses[lVar45 + -0x29] ==
                     (_Bool)borg_items[(ulong)z_info->pack_size + 5].sval)) &&
                   (borg_items[(ulong)z_info->pack_size + 5].iqty != '\0')) {
LAB_0024ef25:
                  borg.trait[0xd5] = borg.trait[0xd5] + uVar28;
                }
                break;
              case 0x16:
                _Var23 = pbVar33->curses[lVar45 + -0x29];
                if (sv_staff_teleportation == (uint)_Var23) {
                  borg.trait[0xd4] = borg.trait[0xd4] + uVar28;
                  wVar27 = borg_activate_failure(L'\x16',(uint)_Var23);
                  if (wVar27 < L'Ǵ') {
                    borg.trait[0xd4] =
                         borg.trait[0xd4] + (int)*(short *)(pbVar33->curses + lVar45 + -0x28);
                  }
                }
                else if (sv_staff_speed == (uint)_Var23) {
                  uVar46 = (uint)*(short *)(pbVar33->curses + lVar45 + -0x28);
LAB_0024f136:
                  borg.trait[0xda] = borg.trait[0xda] + uVar46;
                }
                else {
                  wVar27 = (wchar_t)_Var23;
                  if (sv_staff_healing == wVar27) {
                    uVar46 = (uint)*(short *)(pbVar33->curses + lVar45 + -0x28);
                    goto LAB_0024f1c2;
                  }
                  if (sv_staff_the_magi == wVar27) {
                    borg.trait[0xdb] =
                         borg.trait[0xdb] + (int)*(short *)(pbVar33->curses + lVar45 + -0x28);
                  }
                  else if (sv_staff_destruction == wVar27) {
                    borg.trait[0xdc] =
                         borg.trait[0xdc] + (int)*(short *)(pbVar33->curses + lVar45 + -0x28);
                  }
                  else if (sv_staff_power == wVar27) {
                    borg.trait[0x100] = borg.trait[0x100] + uVar29;
                  }
                  else if (sv_staff_holiness == (uint)_Var23) {
                    borg.trait[0x100] = borg.trait[0x100] + uVar29;
                    uVar46 = (uint)*(short *)(pbVar33->curses + lVar45 + -0x28);
                    goto LAB_0024f1c2;
                  }
                }
                break;
              case 0x17:
                _Var23 = pbVar33->curses[lVar45 + -0x29];
                if (sv_wand_teleport_away == (uint)_Var23) {
                  borg.trait[0xdd] =
                       borg.trait[0xdd] + (int)*(short *)(pbVar33->curses + lVar45 + -0x28);
                }
                if ((sv_wand_stinking_cloud == (uint)_Var23) && (borg.trait[0x6a] < 0x1e)) {
                  borg.trait[0x101] =
                       borg.trait[0x101] + (int)*(short *)(pbVar33->curses + lVar45 + -0x28);
                }
                if ((sv_wand_magic_missile == (uint)_Var23) && (borg.trait[0x6a] < 0x1e)) {
                  borg.trait[0x101] =
                       borg.trait[0x101] + (int)*(short *)(pbVar33->curses + lVar45 + -0x28);
                }
                if (sv_wand_annihilation == (uint)_Var23) {
                  borg.trait[0x101] =
                       borg.trait[0x101] + (int)*(short *)(pbVar33->curses + lVar45 + -0x28);
                }
                break;
              case 0x18:
                _Var23 = pbVar33->curses[lVar45 + -0x29];
                wVar27 = (wchar_t)_Var23;
                if (sv_rod_recall == (uint)_Var23) {
                  wVar27 = borg_activate_failure(L'\x18',wVar27);
                  if (wVar27 < L'Ǵ') {
                    uVar46 = (uint)pbVar33->curses[lVar45 + -0x26] * 100;
LAB_0024f003:
                    borg.trait[0x26] = borg.trait[0x26] + uVar46;
                  }
                  else {
                    borg.trait[0x26] = borg.trait[0x26] + (uint)pbVar33->curses[lVar45 + -0x26];
                  }
                }
                else if (sv_rod_detection == (uint)_Var23) {
                  iVar34 = uVar29 * 100;
                  *(ulong *)(borg.trait + 0xdf) =
                       CONCAT44(iVar34 + (int)((ulong)*(undefined8 *)(borg.trait + 0xdf) >> 0x20),
                                iVar34 + (int)*(undefined8 *)(borg.trait + 0xdf));
                  piVar31[0xe1] = piVar31[0xe1] + iVar34;
                }
                else {
                  wVar35 = (wchar_t)_Var23;
                  if (sv_rod_illumination == wVar35) {
                    borg.trait[0xe4] = borg.trait[0xe4] + uVar29 * 100;
                  }
                  else if (sv_rod_speed == wVar35) {
                    wVar27 = borg_activate_failure(L'\x18',wVar27);
                    if (wVar27 < L'Ǵ') {
                      uVar46 = (uint)pbVar33->curses[lVar45 + -0x26] * 100;
                      goto LAB_0024f136;
                    }
                    borg.trait[0xda] = borg.trait[0xda] + (uint)pbVar33->curses[lVar45 + -0x26];
                  }
                  else if (sv_rod_mapping == wVar35) {
                    borg.trait[0xe2] = borg.trait[0xe2] + uVar28 * 100;
                  }
                  else if (sv_rod_healing == wVar35) {
                    wVar27 = borg_activate_failure(L'\x18',wVar27);
                    if (wVar27 < L'Ǵ') {
                      borg.trait[0xd6] =
                           borg.trait[0xd6] + (uint)pbVar33->curses[lVar45 + -0x26] * 3;
                    }
                    else {
                      borg.trait[0xd6] =
                           (uint)pbVar33->curses[lVar45 + -0x26] + borg.trait[0xd6] + 1;
                    }
                  }
                  else if ((((sv_rod_light == wVar35) || (sv_rod_fire_bolt == wVar35)) ||
                           (sv_rod_elec_bolt == wVar35)) ||
                          ((sv_rod_cold_bolt == wVar35 || (sv_rod_acid_bolt == wVar27)))) {
                    borg.trait[0xfb] = borg.trait[0xfb] + uVar28;
                  }
                  else if (((sv_rod_drain_life == wVar27) || (sv_rod_fire_ball == wVar27)) ||
                          ((sv_rod_elec_ball == wVar27 ||
                           ((sv_rod_cold_ball == wVar27 || (sv_rod_acid_ball == wVar27)))))) {
                    borg.trait[0xfc] = borg.trait[0xfc] + uVar28;
                  }
                }
                break;
              case 0x19:
                _Var23 = pbVar33->curses[lVar45 + -0x29];
                if (sv_scroll_identify == (uint)_Var23) {
                  borg.trait[0xd9] = borg.trait[0xd9] + uVar28;
                }
                else if (sv_scroll_recharging == (uint)_Var23) {
                  borg.trait[0xe3] = borg.trait[0xe3] + uVar28;
                }
                else {
                  wVar27 = (wchar_t)_Var23;
                  if (sv_scroll_phase_door == wVar27) {
                    borg.trait[0xd2] = borg.trait[0xd2] + uVar28;
                  }
                  else if (sv_scroll_teleport == wVar27) {
                    borg.trait[0xd3] = borg.trait[0xd3] + uVar28;
                  }
                  else {
                    if (sv_scroll_word_of_recall == wVar27) goto LAB_0024f003;
                    if (sv_scroll_enchant_armor == wVar27) {
                      borg.trait[0xed] = borg.trait[0xed] + uVar28;
                    }
                    else {
                      wVar27 = (wchar_t)_Var23;
                      if (sv_scroll_star_enchant_armor == wVar27) {
                        borg.trait[0xee] = borg.trait[0xee] + uVar28;
                      }
                      else if (sv_scroll_enchant_weapon_to_hit == wVar27) {
                        borg.trait[0xea] = borg.trait[0xea] + uVar28;
                      }
                      else if (sv_scroll_enchant_weapon_to_dam == wVar27) {
                        borg.trait[0xeb] = borg.trait[0xeb] + uVar28;
                      }
                      else if (sv_scroll_star_enchant_weapon == wVar27) {
                        borg.trait[0xec] = borg.trait[0xec] + uVar28;
                      }
                      else if (sv_scroll_protection_from_evil == wVar27) {
                        borg.trait[0xe5] = borg.trait[0xe5] + uVar28;
                      }
                      else if (sv_scroll_rune_of_protection == wVar27) {
                        borg.trait[0xe6] = borg.trait[0xe6] + uVar28;
                      }
                      else if (sv_scroll_teleport_level == wVar27) {
                        borg.trait[0xf7] = borg.trait[0xf7] + uVar29;
                        piVar31[0xd3] = piVar31[0xd3] + 1;
                      }
                      else if (sv_scroll_mass_banishment == wVar27) {
                        borg.trait[0xf9] = borg.trait[0xf9] + uVar29;
                      }
                    }
                  }
                }
                break;
              case 0x1a:
                _Var23 = pbVar33->curses[lVar45 + -0x29];
                if (sv_potion_healing == (uint)_Var23) {
LAB_0024f1c2:
                  piVar31[0xd6] = piVar31[0xd6] + uVar46;
                }
                else if (sv_potion_star_healing == (uint)_Var23) {
                  borg.trait[0xd7] = borg.trait[0xd7] + uVar29;
                }
                else {
                  wVar27 = (wchar_t)_Var23;
                  if (sv_potion_life == wVar27) {
                    borg.trait[0xd8] = borg.trait[0xd8] + uVar29;
                  }
                  else if (sv_potion_cure_critical == wVar27) {
                    borg.trait[0xe7] = borg.trait[0xe7] + uVar29;
                  }
                  else if (sv_potion_cure_serious == wVar27) {
                    borg.trait[0xe8] = borg.trait[0xe8] + uVar29;
                  }
                  else if (sv_potion_cure_light == wVar27) {
                    borg.trait[0xe9] = borg.trait[0xe9] + uVar29;
                  }
                  else {
                    wVar27 = (wchar_t)_Var23;
                    if (sv_potion_cure_poison == wVar27) {
                      borg.trait[0xde] = borg.trait[0xde] + uVar29;
                    }
                    else if (sv_potion_resist_heat == wVar27) {
                      borg.trait[0xf4] = borg.trait[0xf4] + uVar29;
                    }
                    else if (sv_potion_resist_cold == wVar27) {
                      borg.trait[0xf5] = borg.trait[0xf5] + uVar29;
                    }
                    else if (sv_potion_resist_pois == wVar27) {
                      borg.trait[0xf6] = borg.trait[0xf6] + uVar29;
                    }
                    else {
                      uVar26 = (ushort)_Var3;
                      if (sv_potion_inc_str == wVar27) {
                        borg.amt_statgain[0] = borg.amt_statgain[0] + uVar26;
                      }
                      else if (sv_potion_inc_int == wVar27) {
                        borg.amt_statgain[1] = borg.amt_statgain[1] + uVar26;
                      }
                      else if (sv_potion_inc_wis == wVar27) {
                        borg.amt_statgain[2] = borg.amt_statgain[2] + uVar26;
                      }
                      else if (sv_potion_inc_dex == wVar27) {
                        borg.amt_statgain[3] = borg.amt_statgain[3] + uVar26;
                      }
                      else {
                        wVar27 = (wchar_t)_Var23;
                        if (sv_potion_inc_con != wVar27) {
                          if (sv_potion_inc_all != wVar27) {
                            if (sv_potion_restore_life == wVar27) {
                              borg.trait[0x7e] = 1;
                            }
                            else if (sv_potion_speed == wVar27) goto LAB_0024f136;
                            break;
                          }
                          auVar52 = pshuflw(ZEXT416(uVar29),ZEXT416(uVar29),0);
                          borg.amt_statgain[0] = auVar52._0_2_ + borg.amt_statgain[0];
                          borg.amt_statgain[1] = auVar52._2_2_ + borg.amt_statgain[1];
                          borg.amt_statgain[2] = auVar52._4_2_ + borg.amt_statgain[2];
                          borg.amt_statgain[3] = auVar52._6_2_ + borg.amt_statgain[3];
                        }
                        borg.amt_statgain[4] = borg.amt_statgain[4] + uVar26;
                      }
                    }
                  }
                }
                break;
              case 0x1b:
                if (sv_light_lantern == (uint)borg_items[(ulong)z_info->pack_size + 5].sval)
                goto LAB_0024ef25;
                break;
              case 0x1c:
switchD_0024ed5a_caseD_1c:
                _Var23 = borg_obj_has_effect(*(uint32_t *)(pbVar33->curses + lVar45 + -0x32),L'\a',
                                             L'\xffffffff');
                if ((!_Var23) &&
                   (_Var23 = borg_obj_has_effect(*(uint32_t *)(pbVar33->curses + lVar45 + -0x32),
                                                 L'\n',L'\x04'), !_Var23)) {
                  if (pbVar33->curses[lVar45 + -0x2a] == true) {
                    _Var23 = borg_obj_has_effect(*(uint32_t *)(pbVar33->curses + lVar45 + -0x32),
                                                 L'\x06',L'\0');
                    lVar37 = 0xa4;
                    if (_Var23) {
LAB_0024f2c3:
                      *(int *)((long)borg.trait + lVar37) =
                           *(int *)((long)borg.trait + lVar37) +
                           (uint)pbVar33->curses[lVar45 + -0x26];
                    }
                  }
                  else {
                    _Var23 = pbVar33->curses[lVar45 + -0x29];
                    lVar37 = 0xa4;
                    if ((((((sv_food_apple == (uint)_Var23) || (sv_food_handful == (uint)_Var23)) ||
                          (wVar27 = (wchar_t)_Var23, sv_food_slime_mold == wVar27)) ||
                         (((sv_food_pint == wVar27 || (sv_food_sip == wVar27)) ||
                          ((lVar37 = 0xa0, sv_food_ration == wVar27 ||
                           ((wVar27 = (wchar_t)_Var23, sv_food_slice == wVar27 ||
                            (sv_food_honey_cake == wVar27)))))))) || (sv_food_waybread == wVar27))
                       || (sv_food_draught == wVar27)) goto LAB_0024f2c3;
                  }
                  _Var23 = borg_obj_has_effect(*(uint32_t *)(pbVar33->curses + lVar45 + -0x32),L'\b'
                                               ,L'\a');
                  if (_Var23) {
                    borg.trait[0xde] = borg.trait[0xde] + (uint)pbVar33->curses[lVar45 + -0x26];
                  }
                  _Var23 = borg_obj_has_effect(*(uint32_t *)(pbVar33->curses + lVar45 + -0x32),L'\b'
                                               ,L'\x04');
                  if (_Var23) {
                    borg.trait[0x2a] = borg.trait[0x2a] + (uint)pbVar33->curses[lVar45 + -0x26];
                  }
                  _Var23 = borg_obj_has_effect(*(uint32_t *)(pbVar33->curses + lVar45 + -0x32),L'\b'
                                               ,L'\x02');
                  if (_Var23) {
                    borg.trait[0x2b] = borg.trait[0x2b] + (uint)pbVar33->curses[lVar45 + -0x26];
                  }
                }
                break;
              case 0x1d:
                _Var23 = pbVar33->curses[lVar45 + -0x29];
                wVar27 = (wchar_t)_Var23;
                if ((((sv_mush_purging != (uint)_Var23) && (sv_mush_restoring != (uint)_Var23)) &&
                    (sv_mush_cure_mind != wVar27)) ||
                   ((borg_cfg[1] == 0 || (borg_cfg[2] <= borg.trait[0x24])))) {
                  if (((((sv_mush_second_sight == wVar27) ||
                        ((wVar35 = (wchar_t)_Var23, sv_mush_emergency == wVar35 ||
                         (sv_mush_terror == wVar35)))) || (sv_mush_stoneskin == wVar35)) ||
                      ((sv_mush_debility == wVar35 || (sv_mush_sprinting == wVar27)))) &&
                     ((borg_cfg[1] != 0 && (borg_cfg[2] <= borg.trait[0x24])))) {
                    borg.trait[0xfa] = borg.trait[0xfa] + (uint)_Var3;
                  }
                  goto switchD_0024ed5a_caseD_1c;
                }
                break;
              case 0x1e:
              case 0x1f:
              case 0x20:
              case 0x21:
              case 0x22:
                _Var23 = obj_kind_can_browse(k_info + *(uint *)(pbVar33->curses + lVar45 + -0x32));
                if (_Var23) {
                  _Var23 = pbVar33->curses[lVar45 + -0x26];
                  wVar27 = borg_get_book_num((uint)pbVar33->curses[lVar45 + -0x29]);
                  borg.amt_book[wVar27] = borg.amt_book[wVar27] + (ushort)_Var23;
                }
              }
            }
          }
        }
      }
      lVar42 = lVar42 + 1;
      lVar45 = lVar45 + 0x388;
      piVar31 = borg.trait;
    } while (lVar42 < (long)((ulong)z_info->pack_size - (long)borg.trait[0x9e]));
  }
  iVar34 = borg.has[kv_flask_oil];
  if ((iVar34 != 0) && (piVar31[0x23] < 0xf)) {
    iVar41 = 0xf;
    if (iVar34 < 0xf) {
      iVar41 = iVar34;
    }
    piVar31[0x9b] = piVar31[0x9b] + iVar41;
  }
  _Var23 = borg_spell_legal_fail(REMOVE_HUNGER,L'P');
  if ((_Var23) || (_Var23 = borg_spell_legal_fail(HERBAL_CURING,L'P'), _Var23)) {
    borg.trait[0x27] = borg.trait[0x27] + 1000;
  }
  _Var23 = borg_spell_legal(IDENTIFY_RUNE);
  if (_Var23) {
    borg.trait[0xd9] = borg.trait[0xd9] + 1000;
  }
  _Var23 = borg_spell_legal(FIND_TRAPS_DOORS_STAIRS);
  if ((_Var23) || (_Var23 = borg_spell_legal(DETECTION), _Var23)) {
    borg.trait[0xdf] = 1000;
  }
  _Var23 = borg_spell_legal(REVEAL_MONSTERS);
  if ((((_Var23) || (_Var23 = borg_spell_legal(DETECT_LIFE), _Var23)) ||
      (_Var23 = borg_spell_legal(DETECT_EVIL), _Var23)) ||
     (((_Var23 = borg_spell_legal(READ_MINDS), _Var23 ||
       (_Var23 = borg_spell_legal(DETECT_MONSTERS), _Var23)) ||
      (_Var23 = borg_spell_legal(SEEK_BATTLE), _Var23)))) {
    borg.trait[0xe1] = 1000;
  }
  _Var23 = borg_spell_legal(DETECTION);
  if (((_Var23) || (_Var23 = borg_equips_item(act_enlightenment,false), _Var23)) ||
     (_Var23 = borg_equips_item(act_clairvoyance,false), _Var23)) {
    piVar31 = borg.trait;
    piVar31[0xdf] = 1000;
    piVar31[0xe0] = 1000;
    piVar31[0xe1] = 1000;
  }
  _Var23 = borg_spell_legal(SENSE_INVISIBLE);
  if (_Var23) {
    borg.trait[0x103] = 1;
  }
  _Var23 = borg_spell_legal(SENSE_SURROUNDINGS);
  if (((_Var23) || (_Var23 = borg_equips_item(act_detect_all,false), _Var23)) ||
     (_Var23 = borg_equips_item(act_mapping,false), _Var23)) {
    piVar31 = borg.trait;
    piVar31[0xdf] = 1000;
    piVar31[0xe0] = 1000;
    piVar31[0xe2] = 1000;
  }
  _Var23 = borg_spell_legal(LIGHT_ROOM);
  if (((_Var23) || (_Var23 = borg_equips_item(act_light,false), _Var23)) ||
     ((_Var23 = borg_equips_item(act_illumination,false), _Var23 ||
      (_Var23 = borg_spell_legal(CALL_LIGHT), _Var23)))) {
    borg.trait[0xe4] = borg.trait[0xe4] + 1000;
  }
  _Var23 = borg_spell_legal(PROTECTION_FROM_EVIL);
  if (((_Var23) || (_Var23 = borg_equips_item(act_protevil,false), _Var23)) ||
     ((borg.has[kv_staff_holiness] != 0 || (_Var23 = borg_equips_item(act_staff_holy,false), _Var23)
      ))) {
    borg.trait[0xe5] = borg.trait[0xe5] + 1000;
  }
  _Var23 = borg_spell_legal(GLYPH_OF_WARDING);
  if ((_Var23) || (_Var23 = borg_equips_item(act_glyph,false), _Var23)) {
    borg.trait[0xe6] = borg.trait[0xe6] + 1000;
  }
  _Var23 = borg_spell_legal(FIND_TRAPS_DOORS_STAIRS);
  if (_Var23) {
    piVar31 = borg.trait;
    piVar31[0xdf] = 1000;
    piVar31[0xe0] = 1000;
  }
  _Var23 = borg_spell_legal_fail(ENCHANT_WEAPON,L'A');
  if ((_Var23) || (_Var23 = borg_equips_item(act_enchant_weapon,false), _Var23)) {
    piVar31 = borg.trait;
    *(ulong *)(borg.trait + 0xea) =
         CONCAT44((int)((ulong)*(undefined8 *)(borg.trait + 0xea) >> 0x20) + 1000,
                  (int)*(undefined8 *)(borg.trait + 0xea) + 1000);
    piVar31[0xec] = piVar31[0xec] + 1000;
  }
  _Var23 = borg_equips_item(act_enchant_tohit,false);
  if (_Var23) {
    borg.trait[0xea] = borg.trait[0xea] + 1000;
  }
  _Var23 = borg_equips_item(act_enchant_todam,false);
  if (_Var23) {
    borg.trait[0xeb] = borg.trait[0xeb] + 1000;
  }
  _Var23 = borg_equips_item(act_firebrand,false);
  if ((_Var23) || (_Var23 = borg_spell_legal_fail(BRAND_AMMUNITION,L'A'), _Var23)) {
    borg.trait[0xef] = borg.trait[0xef] + 1000;
  }
  _Var23 = borg_spell_legal_fail(ENCHANT_ARMOUR,L'A');
  if (((_Var23) || (_Var23 = borg_equips_item(act_enchant_armor,false), _Var23)) ||
     (_Var23 = borg_equips_item(act_enchant_armor2,false), _Var23)) {
    *(ulong *)(borg.trait + 0xed) =
         CONCAT44((int)((ulong)*(undefined8 *)(borg.trait + 0xed) >> 0x20) + 1000,
                  (int)*(undefined8 *)(borg.trait + 0xed) + 1000);
  }
  _Var23 = borg_spell_legal_fail(TURN_STONE_TO_MUD,L'(');
  if (((_Var23) || (_Var23 = borg_equips_item(act_stone_to_mud,false), _Var23)) ||
     (_Var23 = borg_equips_ring(sv_ring_digging), _Var23)) {
    borg.trait[0xff] = borg.trait[0xff] + 1;
  }
  _Var23 = borg_spell_legal_fail(WORD_OF_RECALL,L'(');
  if ((_Var23) || ((borg.trait[0x69] == 100 && (_Var23 = borg_spell_legal(WORD_OF_RECALL), _Var23)))
     ) {
    borg.trait[0x26] = borg.trait[0x26] + 1000;
  }
  _Var23 = borg_equips_item(act_recall,false);
  if (_Var23) {
    borg.trait[0x26] = borg.trait[0x26] + 1;
  }
  _Var23 = borg_spell_legal_fail(TELEPORT_LEVEL,L'\x14');
  if (_Var23) {
    borg.trait[0xf7] = borg.trait[0xf7] + 1000;
  }
  _Var23 = borg_spell_legal_fail(PHASE_DOOR,L'\x03');
  if (_Var23) {
    borg.trait[0xd2] = borg.trait[0xd2] + 1000;
  }
  _Var23 = borg_equips_item(act_tele_phase,false);
  if (_Var23) {
    borg.trait[0xd2] = borg.trait[0xd2] + 1;
  }
  _Var23 = borg_spell_legal_fail(TELEPORT_SELF,L'\x01');
  if ((((_Var23) || (_Var23 = borg_spell_legal_fail(PORTAL,L'\x01'), _Var23)) ||
      (_Var23 = borg_spell_legal_fail(SHADOW_SHIFT,L'\x01'), _Var23)) ||
     (_Var23 = borg_spell_legal_fail(DIMENSION_DOOR,L'\x01'), _Var23)) {
    borg.trait[0xd3] = borg.trait[0xd3] + 1000;
  }
  _Var23 = borg_equips_item(act_tele_long,false);
  if (_Var23) {
    *(ulong *)(borg.trait + 0xd3) =
         CONCAT44((int)((ulong)*(undefined8 *)(borg.trait + 0xd3) >> 0x20) + 1,
                  (int)*(undefined8 *)(borg.trait + 0xd3) + 1);
  }
  _Var23 = borg_spell_legal_fail(TELEPORT_OTHER,L'(');
  if (_Var23) {
    borg.trait[0xdd] = borg.trait[0xdd] + 1000;
  }
  _Var23 = borg_spell_legal(HOLY_WORD);
  if (_Var23) {
    borg.trait[0xf8] = borg.trait[0xf8] + 1000;
  }
  _Var23 = borg_spell_legal(HASTE_SELF);
  if (((_Var23) || (_Var23 = borg_equips_item(act_haste,false), _Var23)) ||
     ((_Var23 = borg_equips_item(act_haste1,false), _Var23 ||
      (_Var23 = borg_equips_item(act_haste2,false), _Var23)))) {
    borg.trait[0xda] = borg.trait[0xda] + 1000;
  }
  _Var23 = borg_equips_item(act_cure_light,false);
  if (_Var23) {
    borg.trait[0xe9] = borg.trait[0xe9] + 1000;
  }
  _Var23 = borg_equips_item(act_cure_serious,false);
  if (_Var23) {
    borg.trait[0xe8] = borg.trait[0xe8] + 1000;
  }
  _Var23 = borg_equips_item(act_cure_critical,false);
  if (_Var23) {
    borg.trait[0xe7] = borg.trait[0xe7] + 1000;
  }
  _Var23 = borg_equips_item(act_cure_full,false);
  if (((_Var23) || (_Var23 = borg_equips_item(act_cure_full2,false), _Var23)) ||
     (((_Var23 = borg_equips_item(act_cure_nonorlybig,false), _Var23 ||
       (((_Var23 = borg_equips_item(act_heal1,false), _Var23 ||
         (_Var23 = borg_equips_item(act_heal2,false), _Var23)) ||
        (_Var23 = borg_equips_item(act_heal3,false), _Var23)))) ||
      (_Var23 = borg_spell_legal(HEALING), _Var23)))) {
    borg.trait[0xd6] = borg.trait[0xd6] + 1000;
  }
  _Var23 = borg_equips_item(act_cure_nonorlybig,false);
  if (((_Var23) || (_Var23 = borg_equips_item(act_restore_exp,false), _Var23)) ||
     ((_Var23 = borg_equips_item(act_restore_st_lev,false), _Var23 ||
      (_Var23 = borg_equips_item(act_restore_life,false), _Var23)))) {
    borg.trait[0x7e] = 1;
  }
  _Var23 = borg_spell_legal(REMEMBRANCE);
  if (((_Var23) || (_Var23 = borg_equips_item(act_cure_nonorlybig,false), _Var23)) ||
     ((_Var23 = borg_equips_item(act_restore_exp,false), _Var23 ||
      ((_Var23 = borg_equips_item(act_restore_st_lev,false), _Var23 ||
       (_Var23 = borg_equips_item(act_restore_life,false), _Var23)))))) {
    borg.trait[0x55] = 1;
  }
  _Var23 = borg_equips_item(act_recharge,false);
  if ((_Var23) || (_Var23 = borg_spell_legal(RECHARGING), _Var23)) {
    borg.trait[0xe3] = borg.trait[0xe3] + 1000;
  }
  _Var23 = flag_has_dbg(borg_items[(ulong)z_info->pack_size + 5].flags,5,0x15,
                        "borg_items[INVEN_LIGHT].flags","OF_NO_FUEL");
  piVar31 = borg.trait;
  if ((_Var23) || (borg.trait[0x19] == 4)) {
    borg.trait[0xd5] = borg.trait[0xd5] + 1000;
  }
  if (piVar31[10] < 0x76) {
    borg.need_statgain[0] = true;
  }
  if (piVar31[0xb] < 0x76) {
    borg.need_statgain[1] = true;
  }
  if (piVar31[0xc] < 0x76) {
    borg.need_statgain[2] = true;
  }
  if (piVar31[0xd] < 0x76) {
    borg.need_statgain[3] = true;
  }
  if (piVar31[0xe] < 0x76) {
    borg.need_statgain[4] = true;
  }
  if (piVar31[0x7d] == 0) {
    piVar31[0x7e] = 1;
  }
  iVar34 = piVar31[0x27] + piVar31[0x28] + piVar31[0x29];
  piVar31[0x27] = iVar34;
  if ((piVar31[0x6c] != 0) && (999 < iVar34)) {
    piVar31[0x27] = iVar34 + -1000;
  }
  if ((char)local_60 != '\0') {
    borg_notice_weapon_swap();
    borg_notice_armour_swap();
    piVar31 = borg.trait;
  }
  uVar46 = 1;
  if ((piVar31[0x48] == 0) && (armour_swap_resist_acid == '\0')) {
    uVar28 = 1;
    if (weapon_swap_resist_acid == '\0') {
      _Var23 = borg_spell_legal_fail(RESISTANCE,L'\x0f');
      uVar28 = (uint)_Var23;
      piVar31 = borg.trait;
    }
  }
  else {
    uVar28 = 1;
  }
  piVar31[0x5a] = uVar28;
  if (((piVar31[0x47] == 0) && (armour_swap_resist_elec == '\0')) &&
     (weapon_swap_resist_elec == '\0')) {
    _Var23 = borg_spell_legal_fail(RESISTANCE,L'\x0f');
    uVar46 = (uint)_Var23;
    piVar31 = borg.trait;
  }
  piVar31[0x59] = uVar46;
  uVar46 = 1;
  if ((piVar31[0x45] == 0) && (armour_swap_resist_fire == '\0')) {
    uVar28 = 1;
    if (weapon_swap_resist_fire == '\0') {
      _Var23 = borg_spell_legal_fail(RESISTANCE,L'\x0f');
      uVar28 = (uint)_Var23;
      piVar31 = borg.trait;
    }
  }
  else {
    uVar28 = 1;
  }
  piVar31[0x57] = uVar28;
  if (((piVar31[0x46] == 0) && (armour_swap_resist_cold == '\0')) &&
     (weapon_swap_resist_cold == '\0')) {
    _Var23 = borg_spell_legal_fail(RESISTANCE,L'\x0f');
    uVar46 = (uint)_Var23;
    piVar31 = borg.trait;
  }
  piVar31[0x58] = uVar46;
  uVar46 = 1;
  if (((piVar31[0x49] == 0) && (armour_swap_resist_pois == '\0')) &&
     (weapon_swap_resist_pois == '\0')) {
    _Var23 = borg_spell_legal_fail(RESIST_POISON,L'\x0f');
    uVar46 = (uint)_Var23;
    piVar31 = borg.trait;
  }
  piVar31[0x5b] = uVar46;
  auVar52 = _DAT_0026ca30;
  auVar59._0_4_ = -(uint)(piVar31[0x4a] == 0);
  auVar59._4_4_ = -(uint)(piVar31[0x4b] == 0);
  auVar59._8_4_ = -(uint)(piVar31[0x4c] == 0);
  auVar59._12_4_ = -(uint)(piVar31[0x4d] == 0);
  auVar53._8_4_ = 0xffffffff;
  auVar53._0_8_ = 0xffffffffffffffff;
  auVar53._12_4_ = 0xffffffff;
  auVar55[0] = -(armour_swap_resist_fear == '\0');
  auVar55[1] = -(armour_swap_resist_fear == '\0');
  auVar55[2] = -(armour_swap_resist_fear == '\0');
  auVar55[3] = -(armour_swap_resist_fear == '\0');
  auVar55[4] = -(armour_swap_resist_light == '\0');
  auVar55[5] = -(armour_swap_resist_light == '\0');
  auVar55[6] = -(armour_swap_resist_light == '\0');
  auVar55[7] = -(armour_swap_resist_light == '\0');
  auVar55[8] = -(armour_swap_resist_dark == '\0');
  auVar55[9] = -(armour_swap_resist_dark == '\0');
  auVar55[10] = -(armour_swap_resist_dark == '\0');
  auVar55[0xb] = -(armour_swap_resist_dark == '\0');
  auVar55[0xc] = -(armour_swap_resist_blind == '\0');
  auVar55[0xd] = -(armour_swap_resist_blind == '\0');
  auVar55[0xe] = -(armour_swap_resist_blind == '\0');
  auVar55[0xf] = -(armour_swap_resist_blind == '\0');
  auVar60[0] = -(weapon_swap_resist_fear == '\0');
  auVar60[1] = -(weapon_swap_resist_fear == '\0');
  auVar60[2] = -(weapon_swap_resist_fear == '\0');
  auVar60[3] = -(weapon_swap_resist_fear == '\0');
  auVar60[4] = -(weapon_swap_resist_light == '\0');
  auVar60[5] = -(weapon_swap_resist_light == '\0');
  auVar60[6] = -(weapon_swap_resist_light == '\0');
  auVar60[7] = -(weapon_swap_resist_light == '\0');
  auVar60[8] = -(weapon_swap_resist_dark == '\0');
  auVar60[9] = -(weapon_swap_resist_dark == '\0');
  auVar60[10] = -(weapon_swap_resist_dark == '\0');
  auVar60[0xb] = -(weapon_swap_resist_dark == '\0');
  auVar60[0xc] = -(weapon_swap_resist_blind == '\0');
  auVar60[0xd] = -(weapon_swap_resist_blind == '\0');
  auVar60[0xe] = -(weapon_swap_resist_blind == '\0');
  auVar60[0xf] = -(weapon_swap_resist_blind == '\0');
  *(undefined1 (*) [16])(piVar31 + 0x5c) =
       (auVar60 ^ auVar53 | auVar55 ^ auVar53 | auVar59 ^ auVar53) & _DAT_0026ca30;
  auVar56._0_4_ = -(uint)(piVar31[0x4e] == 0);
  auVar56._4_4_ = -(uint)(piVar31[0x4f] == 0);
  auVar56._8_4_ = -(uint)(piVar31[0x50] == 0);
  auVar56._12_4_ = -(uint)(piVar31[0x51] == 0);
  auVar61[0] = -(armour_swap_resist_conf == '\0');
  auVar61[1] = -(armour_swap_resist_conf == '\0');
  auVar61[2] = -(armour_swap_resist_conf == '\0');
  auVar61[3] = -(armour_swap_resist_conf == '\0');
  auVar61[4] = -(armour_swap_resist_sound == '\0');
  auVar61[5] = -(armour_swap_resist_sound == '\0');
  auVar61[6] = -(armour_swap_resist_sound == '\0');
  auVar61[7] = -(armour_swap_resist_sound == '\0');
  auVar61[8] = -(armour_swap_resist_shard == '\0');
  auVar61[9] = -(armour_swap_resist_shard == '\0');
  auVar61[10] = -(armour_swap_resist_shard == '\0');
  auVar61[0xb] = -(armour_swap_resist_shard == '\0');
  auVar61[0xc] = -(armour_swap_resist_nexus == '\0');
  auVar61[0xd] = -(armour_swap_resist_nexus == '\0');
  auVar61[0xe] = -(armour_swap_resist_nexus == '\0');
  auVar61[0xf] = -(armour_swap_resist_nexus == '\0');
  auVar57[0] = -(weapon_swap_resist_conf == '\0');
  auVar57[1] = -(weapon_swap_resist_conf == '\0');
  auVar57[2] = -(weapon_swap_resist_conf == '\0');
  auVar57[3] = -(weapon_swap_resist_conf == '\0');
  auVar57[4] = -(weapon_swap_resist_sound == '\0');
  auVar57[5] = -(weapon_swap_resist_sound == '\0');
  auVar57[6] = -(weapon_swap_resist_sound == '\0');
  auVar57[7] = -(weapon_swap_resist_sound == '\0');
  auVar57[8] = -(weapon_swap_resist_shard == '\0');
  auVar57[9] = -(weapon_swap_resist_shard == '\0');
  auVar57[10] = -(weapon_swap_resist_shard == '\0');
  auVar57[0xb] = -(weapon_swap_resist_shard == '\0');
  auVar57[0xc] = -(weapon_swap_resist_nexus == '\0');
  auVar57[0xd] = -(weapon_swap_resist_nexus == '\0');
  auVar57[0xe] = -(weapon_swap_resist_nexus == '\0');
  auVar57[0xf] = -(weapon_swap_resist_nexus == '\0');
  *(undefined1 (*) [16])(piVar31 + 0x60) =
       (auVar57 ^ auVar53 | auVar61 ^ auVar53 | auVar56 ^ auVar53) & auVar52;
  auVar62._0_4_ = -(uint)(piVar31[0x52] == 0);
  auVar62._4_4_ = -(uint)(piVar31[0x53] == 0);
  auVar62._8_4_ = -(uint)(piVar31[0x54] == 0);
  auVar62._12_4_ = -(uint)(piVar31[0x55] == 0);
  auVar58[0] = -(armour_swap_resist_neth == '\0');
  auVar58[1] = -(armour_swap_resist_neth == '\0');
  auVar58[2] = -(armour_swap_resist_neth == '\0');
  auVar58[3] = -(armour_swap_resist_neth == '\0');
  auVar58[4] = -(armour_swap_resist_chaos == '\0');
  auVar58[5] = -(armour_swap_resist_chaos == '\0');
  auVar58[6] = -(armour_swap_resist_chaos == '\0');
  auVar58[7] = -(armour_swap_resist_chaos == '\0');
  auVar58[8] = -(armour_swap_resist_disen == '\0');
  auVar58[9] = -(armour_swap_resist_disen == '\0');
  auVar58[10] = -(armour_swap_resist_disen == '\0');
  auVar58[0xb] = -(armour_swap_resist_disen == '\0');
  auVar58[0xc] = -(armour_swap_hold_life == '\0');
  auVar58[0xd] = -(armour_swap_hold_life == '\0');
  auVar58[0xe] = -(armour_swap_hold_life == '\0');
  auVar58[0xf] = -(armour_swap_hold_life == '\0');
  auVar63[0] = -(weapon_swap_resist_neth == '\0');
  auVar63[1] = -(weapon_swap_resist_neth == '\0');
  auVar63[2] = -(weapon_swap_resist_neth == '\0');
  auVar63[3] = -(weapon_swap_resist_neth == '\0');
  auVar63[4] = -(weapon_swap_resist_chaos == '\0');
  auVar63[5] = -(weapon_swap_resist_chaos == '\0');
  auVar63[6] = -(weapon_swap_resist_chaos == '\0');
  auVar63[7] = -(weapon_swap_resist_chaos == '\0');
  auVar63[8] = -(weapon_swap_resist_disen == '\0');
  auVar63[9] = -(weapon_swap_resist_disen == '\0');
  auVar63[10] = -(weapon_swap_resist_disen == '\0');
  auVar63[0xb] = -(weapon_swap_resist_disen == '\0');
  auVar63[0xc] = -(weapon_swap_hold_life == '\0');
  auVar63[0xd] = -(weapon_swap_hold_life == '\0');
  auVar63[0xe] = -(weapon_swap_hold_life == '\0');
  auVar63[0xf] = -(weapon_swap_hold_life == '\0');
  *(undefined1 (*) [16])(piVar31 + 100) =
       (auVar63 ^ auVar53 | auVar58 ^ auVar53 | auVar62 ^ auVar53) & auVar52;
  piVar31[0x68] =
       (uint)(weapon_swap_free_act != '\0' || (armour_swap_free_act != '\0' || piVar31[0x56] != 0));
  iVar34 = borg_adj_str_wgt[piVar31[0xf]];
  piVar31[0x105] = iVar34 * 100;
  iVar41 = piVar31[0x104] + iVar34 * -0x32;
  if (iVar41 == 0 || SBORROW4(piVar31[0x104],iVar34 * 0x32) != iVar41 < 0) {
    iVar34 = piVar31[0x2c];
  }
  else {
    iVar34 = piVar31[0x2c] - iVar41 / (iVar34 * 10);
    piVar31[0x2c] = iVar34;
  }
  if (iVar34 < 200) {
    borg_game_ratio = 1000;
    if (iVar34 < 0x6f) goto LAB_0025061a;
  }
  else {
    piVar31[0x2c] = 199;
    iVar34 = 199;
  }
  borg_game_ratio = (int16_t)(100000 / (ulong)(iVar34 * 10 - 1000));
LAB_0025061a:
  piVar31[0x108] = 0;
  if ((0x62 < piVar31[0x6a]) &&
     ((borg_notice_home((borg_item_conflict *)0x0,false),
      (int)num_life_true + (int)num_ezheal_true + (int)num_heal_true +
      borg.trait[0xd7] + borg.has[kv_potion_healing] + borg.trait[0xd8] < 0x1e ||
      ((int)num_speed + borg.trait[0xda] < 0xf)))) {
    borg.trait[0x108] = 1;
  }
  return;
}

Assistant:

void borg_notice(bool notice_swap)
{
    /* Clear out trait arrays */
    memset(borg.has, 0, z_info->k_max * sizeof(int));
    memset(borg.trait, 0, BI_MAX * sizeof(int));
    memset(borg.activation, 0, z_info->act_max * sizeof(int));

    /* Start with a single blow per turn */
    borg.trait[BI_BLOWS] = 1;

    /* speed starts at 110 */
    borg.trait[BI_SPEED] = 110;

    /* Reset the "ammo" attributes */
    borg.trait[BI_AMMO_TVAL] = -1;
    borg.trait[BI_AMMO_SIDES] = 4;

    /* Many of our variables are tied to borg.trait[], which is erased at the
     * the start of borg_notice().  So we must update the frame the cheat in
     * all the non inventory skills.
     */
    borg_notice_player();

    /*** Process books/spells ***/
    if (borg_do_spell) {
        borg_cheat_spells();
        borg_do_spell = false;
    }

    /* Notice the equipment */
    borg_notice_equipment();

    /* Notice the inventory */
    borg_notice_inventory();

    /* Notice and locate my swap weapon */
    if (notice_swap) {
        borg_notice_weapon_swap();
        borg_notice_armour_swap();
    }
    borg.trait[BI_SRACID]
        = borg.trait[BI_RACID] || armour_swap_resist_acid
          || weapon_swap_resist_acid
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRELEC]
        = borg.trait[BI_RELEC] || armour_swap_resist_elec
          || weapon_swap_resist_elec
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRFIRE]
        = borg.trait[BI_RFIRE] || armour_swap_resist_fire
          || weapon_swap_resist_fire
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRCOLD]
        = borg.trait[BI_RCOLD] || armour_swap_resist_cold
          || weapon_swap_resist_cold
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRPOIS]
        = borg.trait[BI_RPOIS] || armour_swap_resist_pois
          || weapon_swap_resist_pois
          || borg_spell_legal_fail(RESIST_POISON, 15); /* Res P */
    borg.trait[BI_SRFEAR] = borg.trait[BI_RFEAR] || armour_swap_resist_fear
                            || weapon_swap_resist_fear;
    borg.trait[BI_SRLITE] = borg.trait[BI_RLITE] || armour_swap_resist_light
                            || weapon_swap_resist_light;
    borg.trait[BI_SRDARK] = borg.trait[BI_RDARK] || armour_swap_resist_dark
                            || weapon_swap_resist_dark;
    borg.trait[BI_SRBLIND] = borg.trait[BI_RBLIND] || armour_swap_resist_blind
                             || weapon_swap_resist_blind;
    borg.trait[BI_SRCONF] = borg.trait[BI_RCONF] || armour_swap_resist_conf
                            || weapon_swap_resist_conf;
    borg.trait[BI_SRSND] = borg.trait[BI_RSND] || armour_swap_resist_sound
                           || weapon_swap_resist_sound;
    borg.trait[BI_SRSHRD] = borg.trait[BI_RSHRD] || armour_swap_resist_shard
                            || weapon_swap_resist_shard;
    borg.trait[BI_SRNXUS] = borg.trait[BI_RNXUS] || armour_swap_resist_nexus
                            || weapon_swap_resist_nexus;
    borg.trait[BI_SRNTHR] = borg.trait[BI_RNTHR] || armour_swap_resist_neth
                            || weapon_swap_resist_neth;
    borg.trait[BI_SRKAOS] = borg.trait[BI_RKAOS] || armour_swap_resist_chaos
                            || weapon_swap_resist_chaos;
    borg.trait[BI_SRDIS] = borg.trait[BI_RDIS] || armour_swap_resist_disen
                           || weapon_swap_resist_disen;
    borg.trait[BI_SHLIFE] = borg.trait[BI_HLIFE] || armour_swap_hold_life
                            || weapon_swap_hold_life;
    borg.trait[BI_SFRACT]
        = borg.trait[BI_FRACT] || armour_swap_free_act || weapon_swap_free_act;

    /* Apply "encumbrance" from weight */
    /* Extract the "weight limit" (in tenth pounds) */
    borg.trait[BI_CARRY] = borg_adj_str_wgt[borg.trait[BI_STR_INDEX]] * 100;

    /* Apply "encumbrance" from weight */
    if (borg.trait[BI_WEIGHT] > borg.trait[BI_CARRY] / 2)
        borg.trait[BI_SPEED]
            -= ((borg.trait[BI_WEIGHT] - (borg.trait[BI_CARRY] / 2))
                / (borg.trait[BI_CARRY] / 10));

    /* top speed */
    if (borg.trait[BI_SPEED] > 199)
        borg.trait[BI_SPEED] = 199;

    /* Check my ratio for decrementing variables */
    if (borg.trait[BI_SPEED] > 110) {
        borg_game_ratio = 100000 / (((borg.trait[BI_SPEED] - 110) * 10) + 100);
    } else {
        borg_game_ratio = 1000;
    }

    /* set if we are preparing for fighting morgoth or sauron */
    borg.trait[BI_PREP_BIG_FIGHT] = false;
    if (borg.trait[BI_MAXDEPTH] >= 99) {

        /* Examine the home */
        borg_notice_home(NULL, false);

        /* pot of healing + *healing* + life */
        int total_big_heal = borg.has[kv_potion_healing];
        total_big_heal += borg.trait[BI_AEZHEAL];
        total_big_heal += borg.trait[BI_ALIFE];

        /* plus the same at home */
        total_big_heal += num_heal_true;
        total_big_heal += num_ezheal_true;
        total_big_heal += num_life_true;

        /* want bunches of heal and speed to feel prepped for the fight */
        if (total_big_heal < 30 || (num_speed + borg.trait[BI_ASPEED]) < 15)
            borg.trait[BI_PREP_BIG_FIGHT] = true;
    }
}